

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalability_test.c
# Opt level: O0

int transact(nng_socket *clients,int num)

{
  int local_28;
  int local_24;
  int i;
  int rv;
  nng_msg *msg;
  nng_socket *pnStack_10;
  int num_local;
  nng_socket *clients_local;
  
  local_24 = 0;
  local_28 = 0;
  msg._4_4_ = num;
  pnStack_10 = clients;
  while ((((local_28 < msg._4_4_ && (local_24 = nng_msg_alloc((nng_msg **)&i,0), local_24 == 0)) &&
          (local_24 = nng_sendmsg((nng_socket)pnStack_10[local_28].id,_i,0), local_24 == 0)) &&
         (local_24 = nng_recvmsg((nng_socket)pnStack_10[local_28].id,(nng_msg **)&i,0),
         local_24 == 0))) {
    nng_msg_free(_i);
    _i = (nng_msg *)0x0;
    local_28 = local_28 + 1;
  }
  return local_24;
}

Assistant:

int
transact(nng_socket *clients, int num)
{
	nng_msg *msg;
	int      rv = 0;
	int      i;

	for (i = 0; i < num; i++) {

		if (((rv = nng_msg_alloc(&msg, 0)) != 0) ||
		    ((rv = nng_sendmsg(clients[i], msg, 0)) != 0) ||
		    ((rv = nng_recvmsg(clients[i], &msg, 0)) != 0)) {
			// We may leak a message, but this is an
			// error case anyway.
			break;
		}
		nng_msg_free(msg);
		msg = NULL;
	}
	return (rv);
}